

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetInteger64Verifier::verifyFloat
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLfloat reference)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  long *plVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1c8;
  undefined1 local_48 [8];
  StateQueryMemoryWriteGuard<long> state;
  GLint64 expectedGLStateMin;
  GLint64 expectedGLStateMax;
  GLfloat reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  expectedGLStateMax._0_4_ = reference;
  expectedGLStateMax._4_4_ = name;
  _reference_local = testCtx;
  testCtx_local = (TestContext *)this;
  expectedGLStateMin =
       deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<long>(reference);
  state.m_postguard =
       deqp::gls::StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<long>
                 ((GLfloat)expectedGLStateMax);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long> *)local_48);
  pname = expectedGLStateMax._4_4_;
  plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::operator&
                     ((StateQueryMemoryWriteGuard<long> *)local_48);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,pname,plVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long> *)local_48,_reference_local);
  if ((bVar1) &&
     ((plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                          ((StateQueryMemoryWriteGuard *)local_48), *plVar3 < state.m_postguard ||
      (plVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_long_
                          ((StateQueryMemoryWriteGuard *)local_48), expectedGLStateMin < *plVar3))))
  {
    this_00 = tcu::TestContext::getLog(_reference_local);
    tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1c8,
                        (char (*) [66])
                        "// ERROR: expected rounding to the nearest integer, valid range [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&state.m_postguard);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c5c975);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&expectedGLStateMin);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])"]; got ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(StateQueryMemoryWriteGuard<long> *)local_48);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    qVar2 = tcu::TestContext::getTestResult(_reference_local);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                (_reference_local,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyFloat (tcu::TestContext& testCtx, GLenum name, GLfloat reference)
{
	using tcu::TestLog;

	const GLint64 expectedGLStateMax = StateQueryUtil::roundGLfloatToNearestIntegerHalfUp<GLint64>(reference);
	const GLint64 expectedGLStateMin = StateQueryUtil::roundGLfloatToNearestIntegerHalfDown<GLint64>(reference);

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state < expectedGLStateMin || state > expectedGLStateMax)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected rounding to the nearest integer, valid range [" << expectedGLStateMin << "," << expectedGLStateMax << "]; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}